

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Task *pTVar1;
  bool bVar2;
  int nargs;
  Type (*paTVar3) [6000];
  Workitem *this;
  Task *itask;
  undefined8 *puVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  Type *h;
  Type (*paTVar8) [6000];
  long lVar9;
  Type *pTVar10;
  int i;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  arg_info *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  lVar9 = 0;
  printf("Using %d chunks\n",4);
  auVar14 = ZEXT816(0x100000000);
  do {
    *(double *)((long)v + lVar9) =
         (double)((ulong)auVar14._0_4_ | 0x4330000000000000) - 4503599627370496.0;
    *(double *)((long)v + lVar9 + 8) =
         (double)((ulong)auVar14._4_4_ | 0x4330000000000000) - 4503599627370496.0;
    auVar15._0_4_ = auVar14._0_4_ + 2;
    auVar15._4_4_ = auVar14._4_4_ + 2;
    auVar15._8_4_ = auVar14._8_4_;
    auVar15._12_4_ = auVar14._12_4_;
    lVar9 = lVar9 + 0x10;
    auVar14 = auVar15;
  } while (lVar9 != 48000);
  paTVar3 = mx;
  lVar9 = 0;
  h = result;
  do {
    result[lVar9] = 0.0;
    auVar14._8_4_ = (int)lVar9;
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar6 = 0;
    lVar16 = 0;
    lVar17 = 1;
    do {
      (*paTVar3)[lVar6] =
           (double)(lVar16 + lVar9 & 0xffffffffU | 0x4330000000000000) - 4503599627370496.0;
      (*paTVar3 + lVar6)[1] =
           (double)(lVar17 + auVar14._8_8_ & 0xffffffffU | 0x4330000000000000) - 4503599627370496.0;
      lVar6 = lVar6 + 2;
      lVar16 = lVar16 + 2;
      lVar17 = lVar17 + 2;
    } while (lVar6 != 6000);
    lVar9 = lVar9 + 1;
    paTVar3 = paTVar3 + 1;
  } while (lVar9 != 6000);
  paTVar3 = mx;
  lVar9 = 0;
  local_40 = std::chrono::_V2::system_clock::now();
  do {
    result[lVar9] = 0.0;
    dVar12 = 0.0;
    lVar16 = 0;
    do {
      dVar12 = dVar12 + *(double *)((long)*paTVar3 + lVar16) * *(double *)((long)v + lVar16);
      lVar16 = lVar16 + 8;
    } while (lVar16 != 48000);
    result[lVar9] = dVar12;
    lVar9 = lVar9 + 1;
    paTVar3 = paTVar3 + 1;
  } while (lVar9 != 0x5dc);
  uVar11 = 0xfffffffffffffa24;
  paTVar3 = mx;
  local_48 = std::chrono::_V2::system_clock::now();
  pTVar10 = result;
  paTVar8 = mx;
  do {
    local_50 = (arg_info *)0x0;
    local_38 = uVar11;
    nargs = depspawn::internal::
            fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(double(&)[1500],double_const(&)[1500][6000],double_const(&)[6000]),boost::add_reference<mpl_::arg<_1>>>,0l>,double(&)[1500],double_const(&)[1500][6000],double(&)[6000]>
                      (&local_50,(double (*) [1500])h,(double (*) [1500] [6000])paTVar3,&v);
    if ((depspawn::internal::TP == (Task *)0x0) ||
       (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
      depspawn::internal::start_master();
    }
    this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
    depspawn::internal::Workitem::Workitem(this,local_50,nargs);
    pTVar1 = depspawn::internal::TP;
    itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                       &depspawn::internal::TP[9].next);
    *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
    (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
    (itask->func_)._M_invoker = (_Invoker_type)0x0;
    puVar4 = (undefined8 *)operator_new(0x20);
    *puVar4 = mxv;
    puVar4[1] = v;
    puVar4[2] = paTVar8;
    puVar4[3] = pTVar10;
    *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar4;
    (itask->func_)._M_invoker =
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<double[1500]>,_std::reference_wrapper<const_double[1500][6000]>,_std::reference_wrapper<double[6000]>))(double_(&)[1500],_const_double_(&)[1500][6000],_const_double_(&)[6000])>_>
         ::_M_invoke;
    (itask->func_).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<double[1500]>,_std::reference_wrapper<const_double[1500][6000]>,_std::reference_wrapper<double[6000]>))(double_(&)[1500],_const_double_(&)[1500][6000],_const_double_(&)[6000])>_>
         ::_M_manager;
    itask->ctx_ = this;
    itask->next = pTVar1;
    depspawn::internal::Workitem::insert_in_worklist(this,itask);
    depspawn::spawn<void(double(&)[1500]),double(&)[1500]>(pica,(double (*) [1500])h);
    uVar11 = local_38 + 0x5dc;
    paTVar8 = paTVar8 + 0x5dc;
    paTVar3 = (Type (*) [6000])((long)paTVar3 + 72000000);
    pTVar10 = pTVar10 + 0x5dc;
    h = (Type *)((long)h + 12000);
  } while (uVar11 < 0x1194);
  depspawn::wait_for_all();
  lVar9 = std::chrono::_V2::system_clock::now();
  dVar12 = (double)(local_48 - local_40) / 1000000000.0;
  dVar13 = (double)(lVar9 - local_48) / 1000000000.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Serial time: ",0xd);
  poVar5 = std::ostream::_M_insert<double>(dVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s.  Parallel time: ",0x13);
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s.\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Speedup (using ",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," chunks): ",10);
  poVar5 = std::ostream::_M_insert<double>(dVar12 / dVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  bVar2 = test();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TEST ",5);
  pcVar7 = "UNSUCCESSFUL";
  if (bVar2) {
    pcVar7 = "SUCCESSFUL";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar7,(ulong)!bVar2 * 2 + 10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return (int)!bVar2;
}

Assistant:

int main(int argc, char **argv)
{ int i, j;
  
  assert(!(M % CHUNKS));
  
  printf("Using %d chunks\n", CHUNKS);

  for (i = 0; i < N; i++) {
    v[i] = i;
  }
  
  for (i = 0; i < M; i++) {
    result[i] = 0;
    for( j = 0; j < N; j++)
      mx[i][j] = i + j;
  }
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t0 = std::chrono::high_resolution_clock::now();
  
  mxv( (Type (&)[BCK])result, (const Type (&)[BCK][N])mx, (const Type (&) [N])v);
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t1 = std::chrono::high_resolution_clock::now();

  //matrix - vector product using CHUNKS chunks
  for(i = 0; i < M; i+= BCK) {
    spawn(mxv, (Type (&)[BCK])(result[i]), (const Type (&)[BCK][N]) (mx[i][0]), v);
    // Does not work without casting mxv(result[i], (mx[i][0]), v);
    spawn(pica, (Type (&)[BCK])(result[i]));
  }

  wait_for_all();
  
  std::chrono::time_point<std::chrono::high_resolution_clock> t2 = std::chrono::high_resolution_clock::now();
  
  double serial_time = std::chrono::duration<double>(t1-t0).count();
  double parallel_time = std::chrono::duration<double>(t2-t1).count();
  
  std::cout << "Serial time: " << serial_time << "s.  Parallel time: " << parallel_time << "s.\n";
  std::cout << "Speedup (using " << CHUNKS << " chunks): " <<  (serial_time / parallel_time) << std::endl;
  
  const bool test_ok = test();
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}